

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O0

void cpu_ppc601_store_rtcu_ppc64(CPUPPCState_conflict2 *env,uint32_t value)

{
  uint32_t value_local;
  CPUPPCState_conflict2 *env_local;
  
  _cpu_ppc_store_tbu(env,value);
  return;
}

Assistant:

void cpu_ppc601_store_rtcu (CPUPPCState *env, uint32_t value)
{
    _cpu_ppc_store_tbu(env, value);
}